

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joystickmenu.cpp
# Opt level: O2

int __thiscall FOptionMenuItemJoyMap::GetSelection(FOptionMenuItemJoyMap *this)

{
  FOptionValues *pFVar1;
  int iVar2;
  FOptionValues **ppFVar3;
  long lVar4;
  ulong uVar5;
  FName local_14;
  
  iVar2 = (*SELECTED_JOYSTICK->_vptr_IJoystickConfig[7])
                    (SELECTED_JOYSTICK,
                     (ulong)*(uint *)&(this->super_FOptionMenuItemOptionBase).field_0x34);
  ppFVar3 = TMap<FName,_FOptionValues_*,_THashTraits<FName>,_TValueTraits<FOptionValues_*>_>::
            CheckKey(&OptionValues,&local_14);
  if ((ppFVar3 != (FOptionValues **)0x0) && (pFVar1 = *ppFVar3, pFVar1 != (FOptionValues *)0x0)) {
    lVar4 = 0;
    for (uVar5 = 0; (pFVar1->mValues).Count != uVar5; uVar5 = uVar5 + 1) {
      if (ABS((double)iVar2 - *(double *)((long)&((pFVar1->mValues).Array)->Value + lVar4)) <
          1.1920928955078125e-07) {
        return (int)uVar5;
      }
      lVar4 = lVar4 + 0x18;
    }
  }
  return -1;
}

Assistant:

int GetSelection()
	{
		double f = SELECTED_JOYSTICK->GetAxisMap(mAxis);
		FOptionValues **opt = OptionValues.CheckKey(mValues);
		if (opt != NULL && *opt != NULL)
		{
			// Map from joystick axis to menu selection.
			for(unsigned i = 0; i < (*opt)->mValues.Size(); i++)
			{
				if (fabs(f - (*opt)->mValues[i].Value) < FLT_EPSILON)
				{
					return i;
				}
			}
		}
		return -1;
	}